

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

void __thiscall QMakeEvaluator::message(QMakeEvaluator *this,int type,QString *msg)

{
  QMakeHandler *pQVar1;
  ProFile *pPVar2;
  ushort uVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  long in_FS_OFFSET;
  QArrayData *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->m_handler;
  uVar3 = (this->m_current).line;
  if (uVar3 == 0) {
    local_28 = (QArrayData *)0x0;
    pcStack_20 = (char16_t *)0x0;
    local_18 = 0;
    uVar4 = 0;
  }
  else {
    pPVar2 = (this->m_current).pro;
    local_28 = &((pPVar2->m_fileName).d.d)->super_QArrayData;
    pcStack_20 = (pPVar2->m_fileName).d.ptr;
    local_18 = (pPVar2->m_fileName).d.size;
    if (local_28 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_28->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_28->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      uVar3 = (this->m_current).line;
    }
    uVar4 = 0xffffffff;
    if (uVar3 != 0xffff) {
      uVar4 = (ulong)uVar3;
    }
  }
  (*(code *)**(undefined8 **)pQVar1)(pQVar1,CONCAT44(in_register_00000034,type),msg,&local_28,uVar4)
  ;
  if (local_28 != (QArrayData *)0x0) {
    LOCK();
    (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeEvaluator::message(int type, const QString &msg) const
{
    if (!m_skipLevel)
        m_handler->message(type | (m_cumulative ? QMakeHandler::CumulativeEvalMessage : 0), msg,
                m_current.line ? m_current.pro->fileName() : QString(),
                m_current.line != 0xffff ? m_current.line : -1);
}